

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

float __thiscall masc::polygon::c_ply::getArcLength(c_ply *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ply_vertex *ppVar4;
  float fVar5;
  double dVar6;
  Vector<double,_2> local_30;
  ply_vertex *ppVar3;
  
  fVar5 = this->arclength;
  if ((fVar5 == -3.4028235e+38) && (!NAN(fVar5))) {
    this->arclength = 0.0;
    ppVar4 = this->head;
    do {
      iVar1 = (*ppVar4->_vptr_ply_vertex[3])(ppVar4);
      ppVar3 = (ply_vertex *)CONCAT44(extraout_var,iVar1);
      iVar1 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
      iVar2 = (*ppVar3->_vptr_ply_vertex[2])(ppVar3);
      mathtool::Point<double,_2>::operator-
                ((Point<double,_2> *)CONCAT44(extraout_var_00,iVar1),
                 (Point<double,_2> *)CONCAT44(extraout_var_01,iVar2));
      dVar6 = mathtool::Vector<double,_2>::norm(&local_30);
      fVar5 = (float)((double)this->arclength + dVar6);
      this->arclength = fVar5;
      ppVar4 = ppVar3;
    } while (ppVar3 != this->head);
  }
  return fVar5;
}

Assistant:

float c_ply::getArcLength()
{
	if (arclength == -FLT_MAX){
		arclength = 0;
		ply_vertex * ptr = head;
		do{
			ply_vertex * next = ptr->getNext();
			const Point2d& p1 = ptr->getPos();
			const Point2d& p2 = next->getPos();
			arclength += (p1 - p2).norm();
			ptr = next;
		} while (ptr != head); //end while
	}

	return arclength;
}